

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O3

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::ArrayBoundCastData::BindArrayToArrayCast
          (ArrayBoundCastData *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  LogicalType *source_00;
  LogicalType *target_00;
  _func_int **pp_Var1;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_68;
  BoundCastInfo local_48;
  GetCastFunctionInput local_30;
  
  local_68.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_00 = ArrayType::GetChildType(source);
  target_00 = ArrayType::GetChildType(target);
  local_30.context.ptr = (input->context).ptr;
  local_30.query_location.index = (input->query_location).index;
  CastFunctionSet::GetCastFunction(&local_48,input->function_set,source_00,target_00,&local_30);
  pp_Var1 = (_func_int **)operator_new(0x20);
  pp_Var1[1] = (_func_int *)local_48.function;
  pp_Var1[2] = (_func_int *)local_48.init_local_state;
  *pp_Var1 = (_func_int *)&PTR__ArrayBoundCastData_02458aa8;
  ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)
  (pp_Var1 + 3))->super__Head_base<0UL,_duckdb::BoundCastData_*,_false> =
       (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
       local_48.cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  (this->super_BoundCastData)._vptr_BoundCastData = pp_Var1;
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_68);
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> ArrayBoundCastData::BindArrayToArrayCast(BindCastInput &input, const LogicalType &source,
                                                                   const LogicalType &target) {
	vector<BoundCastInfo> child_cast_info;
	auto &source_child_type = ArrayType::GetChildType(source);
	auto &result_child_type = ArrayType::GetChildType(target);
	auto child_cast = input.GetCastFunction(source_child_type, result_child_type);
	return make_uniq<ArrayBoundCastData>(std::move(child_cast));
}